

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

Statement * __thiscall slang::ast::SubroutineSymbol::getBody(SubroutineSymbol *this)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  Statement *pSVar3;
  ASTContext local_80;
  StatementContext local_48;
  
  pSVar3 = this->stmt;
  if (pSVar3 == (Statement *)0x0) {
    pSVar1 = (this->super_Symbol).originatingSyntax;
    if ((pSVar1 != (SyntaxNode *)0x0) &&
       (bVar2 = slang::syntax::FunctionDeclarationSyntax::isKind(pSVar1->kind), bVar2)) {
      if (this->isConstructing != false) {
        return (Statement *)InvalidStatement::Instance;
      }
      this->isConstructing = true;
      local_80.scope.ptr = &this->super_Scope;
      local_80.lookupIndex = 0xffffffff;
      local_80.flags.m_bits = 0;
      local_80.instanceOrProc = (Symbol *)0x0;
      local_80.firstTempVar = (TempVarSymbol *)0x0;
      local_80.randomizeDetails = (RandomizeDetails *)0x0;
      local_80.assertionInstance = (AssertionInstanceDetails *)0x0;
      if (this->subroutineKind == Function) {
        local_80.flags.m_bits = 0x800;
      }
      local_48.lastEventControl.startLoc = (SourceLocation)0x0;
      local_48.lastEventControl.endLoc = (SourceLocation)0x0;
      local_48.rootAstContext = &local_80;
      local_48.flags.m_bits = 0;
      local_48.blocks._M_ptr = (this->blocks)._M_ptr;
      local_48.blocks._M_extent._M_extent_value = (this->blocks)._M_extent._M_extent_value;
      pSVar3 = Statement::bindItems
                         ((SyntaxList<slang::syntax::SyntaxNode> *)&pSVar1[4].parent,
                          local_48.rootAstContext,&local_48);
      this->stmt = pSVar3;
      Statement::StatementContext::~StatementContext(&local_48);
      this->isConstructing = false;
      return this->stmt;
    }
    pSVar3 = StatementList::makeEmpty((this->super_Scope).compilation);
    this->stmt = pSVar3;
  }
  return pSVar3;
}

Assistant:

const Statement& SubroutineSymbol::getBody() const {
    if (!stmt) {
        auto syntax = getSyntax();
        if (!syntax || !FunctionDeclarationSyntax::isKind(syntax->kind)) {
            // DPI functions, subroutines created from prototypes, etc
            // don't have a real body.
            stmt = &StatementList::makeEmpty(getCompilation());
        }
        else if (isConstructing) {
            // Avoid issues with recursive function calls re-entering this
            // method while we're still constructing.
            return InvalidStatement::Instance;
        }
        else {
            isConstructing = true;
            auto guard = ScopeGuard([this] { isConstructing = false; });

            ASTContext context(*this, LookupLocation::max);
            if (subroutineKind == SubroutineKind::Function)
                context.flags |= ASTFlags::Function;

            Statement::StatementContext stmtCtx(context);
            stmtCtx.blocks = blocks;

            stmt = &Statement::bindItems(syntax->as<FunctionDeclarationSyntax>().items, context,
                                         stmtCtx);
        }
    }
    return *stmt;
}